

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

bool __thiscall
ByteCodeGenerator::CanStackNestedFunc(ByteCodeGenerator *this,FuncInfo *funcInfo,bool trace)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  char16 *pcVar7;
  Scope *pSVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  bool local_8a;
  byte local_89;
  wchar local_78 [3];
  bool callsEval;
  bool doStackNestedFunc;
  char16 debugStringBuffer [42];
  bool trace_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  debugStringBuffer[0x27]._1_1_ = trace;
  unique0x1000057c = funcInfo;
  bVar2 = FuncInfo::IsGlobalFunction(funcInfo);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x754,"(!funcInfo->IsGlobalFunction())","!funcInfo->IsGlobalFunction()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = FuncInfo::HasMaybeEscapedNestedFunc(stack0xffffffffffffffe0);
  local_89 = 0;
  if (!bVar2) {
    bVar2 = IsInDebugMode(this);
    local_89 = 0;
    if (!bVar2) {
      bVar2 = Js::FunctionProxy::IsCoroutine
                        (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
      local_89 = 0;
      if (!bVar2) {
        bVar2 = Js::FunctionProxy::IsModule
                          (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
        local_89 = 0;
        if (!bVar2) {
          bVar2 = Js::ScriptContext::ExceedsStackNestedFuncCount
                            (stack0xffffffffffffffe0->root->nestedCount);
          local_89 = bVar2 ^ 0xff;
        }
      }
    }
  }
  if ((local_89 & 1) == 0) {
    return false;
  }
  bVar2 = FuncInfo::GetCallsEval(stack0xffffffffffffffe0);
  local_8a = true;
  if (!bVar2) {
    local_8a = FuncInfo::GetChildCallsEval(stack0xffffffffffffffe0);
  }
  if (local_8a != false) {
    if ((debugStringBuffer[0x27]._1_1_ & 1) != 0) {
      uVar3 = Js::FunctionProxy::GetSourceContextId
                        (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId
                        (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,StackFuncPhase,uVar3,LVar4);
      if (bVar2) {
        iVar5 = (*(stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy).
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [7])();
        pcVar7 = Js::FunctionProxy::GetDebugNumberSet
                           (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy,
                            (wchar (*) [42])local_78);
        Output::Print(L"HasMaybeEscapedNestedFunc (Eval): %s (function %s)\n",
                      CONCAT44(extraout_var,iVar5),pcVar7);
        Output::Flush();
      }
    }
    return false;
  }
  pSVar8 = FuncInfo::GetBodyScope(stack0xffffffffffffffe0);
  bVar2 = Scope::GetIsObject(pSVar8);
  if (!bVar2) {
    pSVar8 = FuncInfo::GetParamScope(stack0xffffffffffffffe0);
    bVar2 = Scope::GetIsObject(pSVar8);
    if (!bVar2) {
      pSVar8 = FuncInfo::GetFuncExprScope(stack0xffffffffffffffe0);
      if (pSVar8 != (Scope *)0x0) {
        pSVar8 = FuncInfo::GetFuncExprScope(stack0xffffffffffffffe0);
        bVar2 = Scope::GetIsObject(pSVar8);
        if (bVar2) goto LAB_00b7015e;
      }
      bVar2 = FuncInfo::IsBodyAndParamScopeMerged(stack0xffffffffffffffe0);
      if (!bVar2) {
        if ((debugStringBuffer[0x27]._1_1_ & 1) != 0) {
          uVar3 = Js::FunctionProxy::GetSourceContextId
                            (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
          LVar4 = Js::FunctionProxy::GetLocalFunctionId
                            (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,StackFuncPhase,uVar3,LVar4);
          if (bVar2) {
            iVar5 = (*(stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy).
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            Output::Print(L"CanStackNestedFunc: %s (Split Scope)\n",CONCAT44(extraout_var_01,iVar5))
            ;
            Output::Flush();
          }
        }
        return false;
      }
      if (((debugStringBuffer[0x27]._1_1_ & 1) != 0) &&
         (uVar3 = Js::ParseableFunctionInfo::GetNestedCount
                            (stack0xffffffffffffffe0->byteCodeFunction), uVar3 != 0)) {
        uVar3 = Js::FunctionProxy::GetSourceContextId
                          (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
        LVar4 = Js::FunctionProxy::GetLocalFunctionId
                          (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,StackFuncPhase,uVar3,LVar4);
        if (bVar2) {
          iVar5 = (*(stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy).
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])();
          pcVar7 = Js::FunctionProxy::GetDebugNumberSet
                             (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy,
                              (wchar (*) [42])local_78);
          Output::Print(L"DoStackNestedFunc: %s (function %s)\n",CONCAT44(extraout_var_02,iVar5),
                        pcVar7);
          Output::Flush();
        }
      }
      uVar3 = Js::FunctionProxy::GetSourceContextId
                        (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId
                        (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,StackFuncPhase,uVar3,LVar4);
      return (bool)((bVar2 ^ 0xffU) & 1);
    }
  }
LAB_00b7015e:
  if ((debugStringBuffer[0x27]._1_1_ & 1) != 0) {
    uVar3 = Js::FunctionProxy::GetSourceContextId
                      (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId
                      (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,StackFuncPhase,uVar3,LVar4);
    if (bVar2) {
      iVar5 = (*(stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy).
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7]
              )();
      pcVar7 = Js::FunctionProxy::GetDebugNumberSet
                         (&stack0xffffffffffffffe0->byteCodeFunction->super_FunctionProxy,
                          (wchar (*) [42])local_78);
      Output::Print(L"HasMaybeEscapedNestedFunc (ObjectScope): %s (function %s)\n",
                    CONCAT44(extraout_var_00,iVar5),pcVar7);
      Output::Flush();
    }
  }
  return false;
}

Assistant:

bool ByteCodeGenerator::CanStackNestedFunc(FuncInfo * funcInfo, bool trace)
{
#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    Assert(!funcInfo->IsGlobalFunction());
    bool const doStackNestedFunc = !funcInfo->HasMaybeEscapedNestedFunc() && !IsInDebugMode()
        && !funcInfo->byteCodeFunction->IsCoroutine()
        && !funcInfo->byteCodeFunction->IsModule()
        && !Js::ScriptContext::ExceedsStackNestedFuncCount(funcInfo->root->nestedCount);
    if (!doStackNestedFunc)
    {
        return false;
    }

    bool callsEval = funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval();
    if (callsEval)
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("HasMaybeEscapedNestedFunc (Eval): %s (function %s)\n"),
                funcInfo->byteCodeFunction->GetDisplayName(),
                funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
        }
        return false;
    }

    if (funcInfo->GetBodyScope()->GetIsObject() || funcInfo->GetParamScope()->GetIsObject() || (funcInfo->GetFuncExprScope() && funcInfo->GetFuncExprScope()->GetIsObject()))
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("HasMaybeEscapedNestedFunc (ObjectScope): %s (function %s)\n"),
                funcInfo->byteCodeFunction->GetDisplayName(),
                funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
        }
        return false;
    }

    if (!funcInfo->IsBodyAndParamScopeMerged())
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("CanStackNestedFunc: %s (Split Scope)\n"),
                funcInfo->byteCodeFunction->GetDisplayName());
        }
        return false;
    }

    if (trace && funcInfo->byteCodeFunction->GetNestedCount())
    {
        // Only print functions that actually have nested functions, although we will still mark
        // functions that don't have nested child functions as DoStackNestedFunc.
        PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
            _u("DoStackNestedFunc: %s (function %s)\n"),
            funcInfo->byteCodeFunction->GetDisplayName(),
            funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
    }

    return !PHASE_OFF(Js::StackFuncPhase, funcInfo->byteCodeFunction);
}